

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
               (void)

{
  node_ptr plVar1;
  node_ptr plVar2;
  pointer pvVar3;
  node_ptr next;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  Delete_disposer disposer;
  node_ptr plVar6;
  int iVar7;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>
  m;
  shared_count sStack_310;
  char *local_308;
  _Base_ptr local_300;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2f8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2a8;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 local_170 [176];
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  local_c0 [144];
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>
            ();
  local_170._0_8_ = operator_new(0x38);
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_170._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>
              *)(local_170 + 8),&local_2a8,(Column_settings *)local_170._0_8_);
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var4 = (_Base_ptr)operator_new(0xa8);
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4;
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var4[5]._M_parent;
  memset(p_Var4,0,0xa8);
  local_2d8._M_impl._0_4_ = 0;
  local_2f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var4[5]._M_parent;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)p_Var4,&local_2d8);
  local_2d8._M_impl._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_2f8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_2d8);
  local_2d8._M_impl._0_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_2f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_2d8);
  local_2d8._M_impl._0_8_ = (mapped_type *)0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_2f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_2d8);
  local_2d8._M_impl._0_8_ = (mapped_type *)0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_2f8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_2d8);
  local_2d8._M_impl._0_4_ = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_2f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_2d8);
  local_2d8._M_impl._0_4_ = 6;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_2f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_2d8);
  pvVar3 = local_2f8.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2f8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar7 = 0;
    p_Var4 = (_Base_ptr)
             local_2f8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_2d8._M_impl._0_4_ = iVar7;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(local_c0,(key_type *)&local_2d8);
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>
                  *)&local_2d8,pmVar5);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>
                  *)p_Var4,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>
                  *)&local_2d8);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_2d8);
      p_Var4 = (_Base_ptr)&p_Var4->_M_right;
      iVar7 = iVar7 + 1;
    } while (p_Var4 != (_Base_ptr)pvVar3);
  }
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x296);
  local_2d8._M_impl._0_4_ = 3;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_c0,(key_type *)&local_2d8);
  plVar6 = (node_ptr)&pmVar5->column_;
  do {
    plVar6 = (((type *)&plVar6->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar6 == (node_ptr)&pmVar5->column_) break;
  } while (*(int *)&plVar6[1].next_ != 5);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "!m.is_zero_entry(3, 5, false)";
  local_300 = (_Base_ptr)0x1be274;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x297);
  local_2d8._M_impl._0_4_ = 4;
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_c0,(key_type *)&local_2d8);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "!m.is_zero_column(4, false)";
  local_300 = (_Base_ptr)0x1be290;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_2d8._M_impl._0_4_ = 3;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_c0,(key_type *)&local_2d8);
  plVar6 = (node_ptr)&pmVar5->column_;
  do {
    plVar6 = (((type *)&plVar6->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar6 == (node_ptr)&pmVar5->column_) goto LAB_001a27ea;
  } while (*(int *)&plVar6[1].next_ != 5);
  plVar1 = plVar6->next_;
  plVar2 = plVar6->prev_;
  plVar2->next_ = plVar1;
  plVar1->prev_ = plVar2;
  plVar6->next_ = (node_ptr)0x0;
  plVar6->prev_ = (node_ptr)0x0;
  local_2d8._M_impl._0_8_ = pmVar5;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>
  ::Delete_disposer::operator()((Delete_disposer *)&local_2d8,(Entry *)&plVar6[-1].prev_);
LAB_001a27ea:
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x299);
  local_2d8._M_impl._0_4_ = 3;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_c0,(key_type *)&local_2d8);
  plVar6 = (node_ptr)&pmVar5->column_;
  do {
    plVar6 = (((type *)&plVar6->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar6 == (node_ptr)&pmVar5->column_) break;
  } while (*(int *)&plVar6[1].next_ != 5);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "m.is_zero_entry(3, 5, false)";
  local_300 = (_Base_ptr)0x1be274;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x29a);
  local_2d8._M_impl._0_4_ = 4;
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_c0,(key_type *)&local_2d8);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "!m.is_zero_column(4, false)";
  local_300 = (_Base_ptr)0x1be290;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_2d8._M_impl._0_4_ = 4;
  disposer.col_ =
       std::__detail::
       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::at(local_c0,(key_type *)&local_2d8);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)&(disposer.col_)->column_,disposer);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x29c);
  local_2d8._M_impl._0_4_ = 3;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_c0,(key_type *)&local_2d8);
  plVar6 = (node_ptr)&pmVar5->column_;
  do {
    plVar6 = (((type *)&plVar6->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar6 == (node_ptr)&pmVar5->column_) break;
  } while (*(int *)&plVar6[1].next_ != 5);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "m.is_zero_entry(3, 5, false)";
  local_300 = (_Base_ptr)0x1be274;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x29d);
  local_2d8._M_impl._0_4_ = 4;
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_c0,(key_type *)&local_2d8);
  sStack_310.pi_ = (sp_counted_base *)0x0;
  local_308 = "m.is_zero_column(4, false)";
  local_300 = (_Base_ptr)0x1be290;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_2d8._M_impl._0_8_ = &PTR__lazy_ostream_001ec168;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_2f8);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>
             *)local_170);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_2a8);
  return;
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}